

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void show_usage(string *name)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DGRMiner, version 3.0.0",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Author: Karel Vaculik (vaculik.dev@gmail.com)",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Usage: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," <option(s)>",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t-h, --help\t\tShows this help message",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t-v, --verbose\t\tVerbose output",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t-i INPUTFILE\t\tSpecifies the input file",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t-o OUTPUTFILE\t\tSpecifies the common prefix for output files",0x3c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "\t-s K\t\t\tSpecifies the minimum support; decimal value from [0.0, 1.0] if old support measure is used"
             ,99);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "\t-c M\t\t\tSpecifies the minimum confidence; decimal value from [0.0, 1.0]; if not specified, the confidence is not computed"
             ,0x79);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t-w N\t\t\tSpecifies the size of window; 10 by default",0x33);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t-t {bin_nodes,bin_all}\tSpecifies the type of time abstraction",0x3e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "\t-a A\t\t\tSwitches to anomaly detection; Only anomalies with outlierness >= A will be outputted; A is a decimal value from [0.0, 1.0]"
             ,0x83);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\t-m new measures Use new support and dynamic measures.",0x36);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "\t-e heuristics \tUse heuristic version of the algorithm for computing MIS size.",0x4e
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

static void show_usage(std::string name)
{
	std::cerr << "DGRMiner, version 3.0.0"
			  << std::endl
			  << "Author: Karel Vaculik (vaculik.dev@gmail.com)"
			  << std::endl
			  << std::endl
			  << "Usage: " << name << " <option(s)>"
			  << std::endl
			  << std::endl
			  << "\t-h, --help\t\tShows this help message"
			  << std::endl
			  << "\t-v, --verbose\t\tVerbose output"
			  << std::endl
			  << "\t-i INPUTFILE\t\tSpecifies the input file"
			  << std::endl
			  << "\t-o OUTPUTFILE\t\tSpecifies the common prefix for output files"
			  << std::endl
			  << "\t-s K\t\t\tSpecifies the minimum support; decimal value from [0.0, 1.0] if old support measure is used"
			  << std::endl
			  << "\t-c M\t\t\tSpecifies the minimum confidence; decimal value from [0.0, 1.0]; if not specified, the confidence is not computed"
			  << std::endl
			  << "\t-w N\t\t\tSpecifies the size of window; 10 by default"
			  << std::endl
			  << "\t-t {bin_nodes,bin_all}\tSpecifies the type of time abstraction"
			  << std::endl
			  << "\t-a A\t\t\tSwitches to anomaly detection; Only anomalies with outlierness >= A will be outputted; A is a decimal value from [0.0, 1.0]"
			  << std::endl
			  << "\t-m new measures Use new support and dynamic measures."
			  << std::endl
			  << "\t-e heuristics \tUse heuristic version of the algorithm for computing MIS size."
			  << std::endl;
}